

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImage.h
# Opt level: O1

void __thiscall irr::gui::CGUIImage::checkBounds(CGUIImage *this,rect<int> *rect)

{
  vector2d<float> vVar1;
  undefined1 auVar2 [12];
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  rect<int> rVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar14;
  vector2d<int> vVar13;
  undefined1 auVar15 [16];
  
  fVar10 = (this->DrawBounds).UpperLeftCorner.X;
  fVar11 = (this->DrawBounds).UpperLeftCorner.Y;
  vVar1 = (this->DrawBounds).LowerRightCorner;
  uVar4 = (rect->UpperLeftCorner).X;
  uVar5 = (rect->UpperLeftCorner).Y;
  uVar6 = (rect->LowerRightCorner).X;
  iVar3 = (rect->LowerRightCorner).Y;
  rVar7 = *rect;
  fVar12 = (float)((rect->LowerRightCorner).X - (rect->UpperLeftCorner).X);
  fVar14 = (float)(iVar3 - (rect->UpperLeftCorner).Y);
  fVar8 = floorf(fVar14 * (1.0 - vVar1.Y) + 0.5);
  fVar9 = floorf(fVar12 * (1.0 - vVar1.X) + 0.5);
  fVar10 = floorf(fVar12 * fVar10 + 0.5);
  fVar11 = floorf(fVar14 * fVar11 + 0.5);
  vVar13.X = uVar4 + (int)fVar10;
  vVar13.Y = uVar5 + (int)fVar11;
  auVar2._4_4_ = rVar7.LowerRightCorner.X;
  auVar2._8_4_ = rVar7.LowerRightCorner.Y;
  auVar2._0_4_ = uVar5 - (int)fVar11;
  auVar15._0_8_ = auVar2._0_8_ << 0x20;
  auVar15._8_4_ = uVar6 - (int)fVar9;
  auVar15._12_4_ = iVar3 - (int)fVar8;
  rect->UpperLeftCorner = vVar13;
  rect->LowerRightCorner = auVar15._8_8_;
  return;
}

Assistant:

void checkBounds(core::rect<s32> &rect)
	{
		f32 clipWidth = (f32)rect.getWidth();
		f32 clipHeight = (f32)rect.getHeight();

		rect.UpperLeftCorner.X += core::round32(DrawBounds.UpperLeftCorner.X * clipWidth);
		rect.UpperLeftCorner.Y += core::round32(DrawBounds.UpperLeftCorner.Y * clipHeight);
		rect.LowerRightCorner.X -= core::round32((1.f - DrawBounds.LowerRightCorner.X) * clipWidth);
		rect.LowerRightCorner.Y -= core::round32((1.f - DrawBounds.LowerRightCorner.Y) * clipHeight);
	}